

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWJoint.h
# Opt level: O1

void __thiscall COLLADAFW::Joint::~Joint(Joint *this)

{
  ~Joint(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

virtual ~Joint(){}